

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_histogram.c
# Opt level: O0

REF_STATUS ref_histogram_ratio_tec(REF_GRID ref_grid)

{
  uint uVar1;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_HISTOGRAM ref_histogram;
  REF_GRID ref_grid_local;
  
  ref_histogram = (REF_HISTOGRAM)ref_grid;
  uVar1 = ref_histogram_create((REF_HISTOGRAM *)&ref_private_macro_code_rss_1);
  if (uVar1 == 0) {
    uVar1 = ref_histogram_resolution(_ref_private_macro_code_rss_1,0x120,12.0);
    if (uVar1 == 0) {
      uVar1 = ref_histogram_add_ratio(_ref_private_macro_code_rss_1,(REF_GRID)ref_histogram);
      if (uVar1 == 0) {
        if ((*(int *)((long)ref_histogram->max + 4) == 0) &&
           (ref_grid_local._4_4_ = ref_histogram_tec(_ref_private_macro_code_rss_1,"ratio"),
           ref_grid_local._4_4_ != 0)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c"
                 ,0x220,"ref_histogram_ratio_tec",(ulong)ref_grid_local._4_4_,"tec");
        }
        else {
          ref_grid_local._4_4_ = ref_histogram_free(_ref_private_macro_code_rss_1);
          if (ref_grid_local._4_4_ == 0) {
            ref_grid_local._4_4_ = 0;
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c"
                   ,0x222,"ref_histogram_ratio_tec",(ulong)ref_grid_local._4_4_,"free gram");
          }
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c"
               ,0x21d,"ref_histogram_ratio_tec",(ulong)uVar1,"add ratio");
        ref_grid_local._4_4_ = uVar1;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c",
             0x21b,"ref_histogram_ratio_tec",(ulong)uVar1,"res");
      ref_grid_local._4_4_ = uVar1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c",
           0x21a,"ref_histogram_ratio_tec",(ulong)uVar1,"create");
    ref_grid_local._4_4_ = uVar1;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_histogram_ratio_tec(REF_GRID ref_grid) {
  REF_HISTOGRAM ref_histogram;

  RSS(ref_histogram_create(&ref_histogram), "create");
  RSS(ref_histogram_resolution(ref_histogram, 288, 12.0), "res");

  RSS(ref_histogram_add_ratio(ref_histogram, ref_grid), "add ratio");

  if (ref_grid_once(ref_grid))
    RSS(ref_histogram_tec(ref_histogram, "ratio"), "tec");

  RSS(ref_histogram_free(ref_histogram), "free gram");
  return REF_SUCCESS;
}